

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O3

void Warning(char *message,char *badValueMessage,EWStatus type)

{
  if (type == W_EARLY) {
    if (2 < pass) {
      return;
    }
  }
  else if (type == W_PASS03) {
    if (pass - 1U < 2) {
      return;
    }
  }
  else if ((type == W_PASS3) && (pass < 3)) {
    return;
  }
  WarningImpl((char *)0x0,message,badValueMessage,type);
  return;
}

Assistant:

void Warning(const char* message, const char* badValueMessage, EWStatus type) {
	if (isInactiveTypeInCurrentPass(type)) return;
	WarningImpl(nullptr, message, badValueMessage, type);
}